

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O1

void addTests_Image_Function(UnitTestFramework *framework)

{
  _Rb_tree_node_base *p_Var1;
  
  anon_unknown.dwarf_277cd9::FunctionRegistrator::instance();
  for (p_Var1 = anon_unknown.dwarf_277cd9::FunctionRegistrator::instance::registrator._function._M_t
                ._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 !=
      &anon_unknown.dwarf_277cd9::FunctionRegistrator::instance::registrator._function._M_t._M_impl.
       super__Rb_tree_header; p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    UnitTestFramework::add(framework,*(testFunction *)(p_Var1 + 1),(string *)&p_Var1[1]._M_parent);
  }
  std::
  _Rb_tree<bool_(*)(),_std::pair<bool_(*const)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<bool_(*const)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<bool_(*)()>,_std::allocator<std::pair<bool_(*const)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear((_Rb_tree<bool_(*)(),_std::pair<bool_(*const)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<bool_(*const)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<bool_(*)()>,_std::allocator<std::pair<bool_(*const)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&anon_unknown.dwarf_277cd9::FunctionRegistrator::instance::registrator);
  return;
}

Assistant:

void addTests_Image_Function( UnitTestFramework & framework )
{
    FunctionRegistrator::instance().set( framework );
}